

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O1

YieldResult * __thiscall
NEST::NESTcalc::GetYieldIon
          (YieldResult *__return_storage_ptr__,NESTcalc *this,double energy,double density,
          double dfield,double massNum,double atomNum,
          vector<double,_std::allocator<double>_> *NRYieldsParam)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  RandomGen *pRVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  YieldResult result;
  double local_88;
  double local_78;
  
  pRVar5 = RandomGen::rndm();
  iVar4 = RandomGen::SelectRanXeAtom(pRVar5);
  dVar7 = pow(atomNum,0.6666666666666666);
  dVar7 = pow(dVar7 + 14.286609467713793,1.5);
  dVar9 = pow(massNum,3.0);
  dVar8 = (double)iVar4 + massNum;
  dVar10 = pow(dVar8,-2.0);
  dVar7 = pow(dVar7,1.3333333333333333);
  dVar6 = pow(atomNum,-0.3333333333333333);
  dVar7 = dVar6 * dVar7 * dVar10 * dVar9 * 500.0;
  dVar9 = (massNum * 4.0 * (double)iVar4) / (dVar8 * dVar8);
  if (dVar7 < 0.0) {
    dVar7 = sqrt(dVar7);
  }
  else {
    dVar7 = SQRT(dVar7);
  }
  dVar9 = dVar9 / ((1.0 / massNum) * dVar8 * dVar8 * 54.0 * 125.0 * dVar9);
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  local_78 = energy * 1000.0;
  if (local_78 < 0.0) {
    local_78 = sqrt(local_78);
  }
  else {
    local_78 = SQRT(local_78);
  }
  local_78 = local_78 * (dVar9 * 0.5 + 1.0 / dVar7) * 0.6666666666666666;
  dVar7 = pow((massNum * massNum) / 19227.0,0.99199);
  bVar3 = ValidityTests::nearlyEqual(atomNum,2.0,1e-09);
  if ((bVar3) && (bVar3 = ValidityTests::nearlyEqual(massNum,4.0,1e-09), bVar3)) {
    local_78 = pow(energy,0.056972);
    local_78 = local_78 * 0.56136;
  }
  dVar7 = 0.96446 / (dVar7 + 1.0);
  dVar9 = pow(density / 0.2679,-2.3245);
  dVar8 = exp((massNum * 0.25 + -1.0) * 0.17687876);
  dVar10 = pow(dfield,0.515);
  if (this->fdetector->inGas == true) {
    if (dfield < 0.0) {
      dVar10 = sqrt(dfield);
    }
    else {
      dVar10 = SQRT(dfield);
    }
  }
  else {
    dVar6 = dVar10 * 0.095 + -0.025;
    dVar10 = 0.0;
    if (0.0 <= dVar6) {
      dVar10 = dVar6;
    }
  }
  if (local_78 <= dVar7) {
    dVar7 = local_78;
  }
  dVar6 = energy * -0.0013 + 0.13;
  local_88 = 0.0;
  if (0.0 <= dVar6) {
    local_88 = dVar6;
  }
  local_88 = (((dVar8 * 0.02966094 + 1.0 + -0.02966094) * 0.00625) / (dVar9 + 1.0)) / dVar10 +
             local_88;
  dVar9 = pow((density / 10.0) * (density / 10.0) + 1.0,449.61);
  dVar8 = pow(atomNum,1.587);
  local_78 = dVar8 * 0.00178 + 0.64 / dVar9;
  bVar3 = ValidityTests::nearlyEqual(massNum,206.0,1e-09);
  if ((bVar3) && (bVar3 = ValidityTests::nearlyEqual(atomNum,82.0,1e-09), bVar3)) {
    local_88 = exp(dfield * -0.00142053 + -1.28683);
    local_78 = 1.1;
  }
  dVar9 = log10(density);
  dVar8 = pow(dVar9,3.0);
  dVar10 = pow(dVar9,4.0);
  dVar6 = pow(dVar9,5.0);
  dVar1 = pow(dVar9,6.0);
  dVar2 = pow(dVar9,7.0);
  dVar9 = dVar2 * -2.2352 +
          dVar1 * -20.276 +
          dVar6 * -74.194 +
          dVar10 * -136.47 + dVar8 * -123.73 + dVar9 * dVar9 * -33.611 + dVar9 * 25.667 + 28.259;
  dVar7 = (dVar7 * 1000.0 * energy) / dVar9;
  if (this->fdetector->OldW13eV == false) {
    dVar7 = dVar7 * 1.1716263232;
  }
  dVar10 = dVar7 / (local_78 + 1.0);
  dVar8 = 0.0;
  if ((0.0 < dVar10) && (0.0 < local_88)) {
    dVar8 = local_88 * 0.25 * dVar10;
    dVar6 = log(dVar8 + 1.0);
    dVar8 = 1.0 - dVar6 / dVar8;
  }
  bVar3 = ValidityTests::nearlyEqual(massNum,206.0,1e-09);
  if ((bVar3) && (bVar3 = ValidityTests::nearlyEqual(atomNum,82.0,1e-09), bVar3)) {
    pRVar5 = RandomGen::rndm();
    RandomGen::binom_draw
              (pRVar5,(long)(dVar7 - (dVar8 * dVar10 + (local_78 * dVar7) / (local_78 + 1.0))),1.0);
  }
  bVar3 = ValidityTests::nearlyEqual(54.0,18.0,1e-09);
  if (((bVar3) && (bVar3 = ValidityTests::nearlyEqual(atomNum,2.0,1e-09), bVar3)) &&
     (bVar3 = ValidityTests::nearlyEqual(massNum,4.0,1e-09), bVar3)) {
    dVar7 = pow(dfield,7.72848);
    dVar7 = pow(dVar7 + 4.71598,0.109802);
    log(((0.01 / dVar7) / 3.0) * 53287932.86471075 + 1.0);
    pow(dfield,-0.012);
    dVar7 = pow(dfield / 10.0822,1.2076);
    dVar7 = pow(dVar7 + 4.98483,0.97977);
    log(((0.653503 / dVar7) / 3.0) * 229782.85147355372 + 1.0);
    dVar9 = 19.5;
  }
  (*this->_vptr_NESTcalc[0xb])(SUB84(energy,0),dVar9,__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

YieldResult NESTcalc::GetYieldIon(
    double energy, double density, double dfield, double massNum,
    double atomNum,
    const std::vector<double>
        &NRYieldsParam) {  // simply uses the original Lindhard model, but as
                           // cited by Hitachi in:
  // https://indico.cern.ch/event/573069/sessions/230063/attachments/1439101/2214448/Hitachi_XeSAT2017_DM.pdf

  double A1 = massNum, A2 = RandomGen::rndm()->SelectRanXeAtom();
  double Z1 = atomNum, Z2 = ATOM_NUM;
  double Z_mean = pow(pow(Z1, (2. / 3.)) + pow(Z2, (2. / 3.)), 1.5);
  double E1c = pow(A1, 3.) * pow(A1 + A2, -2.) * pow(Z_mean, (4. / 3.)) *
               pow(Z1, (-1. / 3.)) * 500.;
  double E2c = pow(A1 + A2, 2.) * pow(A1, -1.) * Z2 * 125.;
  double gamma = 4. * A1 * A2 / pow(A1 + A2, 2.);
  double Ec_eV = gamma * E2c;
  double Constant = (2. / 3.) * (1. / sqrt(E1c) + 0.5 * sqrt(gamma / Ec_eV));
  double L = Constant * sqrt(energy * 1e3);
  double L_max = 0.96446 / (1. + pow(massNum * massNum / 19227., 0.99199));
  if (ValidityTests::nearlyEqual(atomNum, 2.) &&
      ValidityTests::nearlyEqual(massNum, 4.))
    L = 0.56136 * pow(energy, 0.056972);
  if (L > L_max) L = L_max;
  double densDep = pow(density / 0.2679, -2.3245);
  double massDep =
      0.02966094 * exp(0.17687876 * (massNum / 4. - 1.)) + 1. - 0.02966094;
  double fieldDep = 0.095*pow(dfield,0.515)-0.025; if ( fieldDep < 0. ) fieldDep = 0.;
  if (fdetector->get_inGas()) fieldDep = sqrt(dfield);
  double eneDep = 0.13 - 0.0013 * energy; if ( eneDep < 0. ) eneDep = 0.;
  double ThomasImel = 0.00625 * massDep / (1. + densDep) / fieldDep + eneDep;
  double alpha = 0.64 / pow(1. + pow(density / 10., 2.), 449.61);
  double NexONi = alpha + 0.00178 * pow(atomNum, 1.587);
  if (ValidityTests::nearlyEqual(A1, 206.) &&
      ValidityTests::nearlyEqual(Z1,
                                 82.)) {  // Pb-206 (from Po-210 alpha decay).
    ThomasImel =
        exp(-1.28683 - 1.42053e-03 * dfield);  // updated by Nishat Parveen
    NexONi = 1.1;                              // updated by Nishat Parveen
  }
  const double logden = log10(density);
  double Wq_eV = 28.259 + 25.667 * logden - 33.611 * pow(logden, 2.) -
                 123.73 * pow(logden, 3.) - 136.47 * pow(logden, 4.) -
                 74.194 * pow(logden, 5.) - 20.276 * pow(logden, 6.) -
                 2.2352 * pow(logden, 7.);
  double Nq = 1e3 * L * energy / Wq_eV;
  if (!fdetector->get_OldW13eV()) Nq *= ZurichEXOW;
  double Ni = Nq / (1. + NexONi);
  double recombProb;
  if (Ni > 0. && ThomasImel > 0.)
    recombProb =
        1. - log(1. + (ThomasImel / 4.) * Ni) / ((ThomasImel / 4.) * Ni);
  else {
    recombProb = 0.0;
  }
  double Nph = Nq * NexONi / (1. + NexONi) + recombProb * Ni;
  double Ne = Nq - Nph;
  if (ValidityTests::nearlyEqual(A1, 206.) &&
      ValidityTests::nearlyEqual(Z1, 82.))
    Ne = RandomGen::rndm()->binom_draw(Ne, ChargeLoss);
  // some electrons from lead recoils get absorbed by the Teflon wall
  if (ValidityTests::nearlyEqual(Z2, 18.) &&
      ValidityTests::nearlyEqual(Z1, 2.) &&
      ValidityTests::nearlyEqual(A1, 4.)) {  // alphas in argon
    double factorE = pow((4.71598 + pow(dfield, 7.72848)), 0.109802);
    double Qy = (1. / 6200.) *
                (64478398.7663 -
                 (64478398.7663 * 0.173553719 +
                  (64478398.7663 / 1.21) *
                      (1. - (0.02852 * log(1. + (64478398.7663 / 1.21) *
                                                    ((0.01 / factorE) / 3.))) /
                                ((64478398.7663 / 1.21) * (0.01 / factorE)))));
    double qu = 1. / (1.16 * pow(dfield, -0.012));
    factorE = pow(4.98483 + pow(dfield / 10.0822, 1.2076), 0.97977);
    double Ly =
        qu * (1. / 6500.) *
        (278037.250283 * 0.173553719 +
         (278037.250283 / 1.21) *
             (1. - (2. * log(1. + (278037.250283 / 1.21) *
                                      ((0.653503 / factorE) / 3.))) /
                       ((278037.250283 / 1.21) * (0.653503 / factorE))));
    Ne = Qy * energy;
    Nph = Ly * energy;
    L = 0.0;
    NexONi = 0.21;
    Wq_eV = 19.5;
  }

  YieldResult result{};
  result.PhotonYield = Nph;
  result.ElectronYield = Ne;
  result.ExcitonRatio = NexONi;
  result.Lindhard = L;
  result.ElectricField = dfield;
  result.DeltaT_Scint = -999;
  return YieldResultValidity(
      result, energy, Wq_eV);  // everything needed to calculate fluctuations
}